

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiDisplayTimingTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::wsi::anon_unknown_0::DisplayTimingTestInstance::iterate
          (TestStatus *__return_storage_ptr__,DisplayTimingTestInstance *this)

{
  ostringstream *poVar1;
  DeviceDriver *pDVar2;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_> *__x;
  deUint64 *pdVar3;
  ostringstream *poVar4;
  ostringstream *this_00;
  ostringstream *poVar5;
  VkExtent2D VVar6;
  VkFormat VVar7;
  uint uVar8;
  uint uVar9;
  deUint32 dVar10;
  VkDevice pVVar11;
  pointer pHVar12;
  TestLog *pTVar13;
  pointer ppVVar14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  deUint64 dVar17;
  size_t sVar18;
  VkDevice_s *pVVar19;
  long lVar20;
  void *pvVar21;
  pointer pHVar22;
  undefined8 uVar23;
  bool bVar24;
  bool bVar25;
  VkResult VVar26;
  qpTestResult qVar27;
  mapped_type_conflict1 *pmVar28;
  MessageBuilder *pMVar29;
  deUint64 dVar30;
  mapped_type_conflict1 mVar31;
  size_t ndx_1;
  long lVar32;
  VkStructureType VVar33;
  ulong uVar34;
  size_t ndx;
  ulong uVar35;
  VkPipelineShaderStageCreateInfo stages [2];
  VkPipelineDepthStencilStateCreateInfo depthStencilState;
  VkCommandBufferAllocateInfo allocateInfo;
  VkPipelineRasterizationStateCreateInfo rasterizationState;
  VkSampleMask sampleMask;
  undefined1 local_3d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  _Base_ptr local_3b8;
  VkExtent2D local_3b0;
  undefined4 local_3a8;
  VkPipelineRasterizationStateCreateInfo *local_3a0;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_258;
  VkAttachmentReference colorAttachmentRefs [1];
  VkPipelineMultisampleStateCreateInfo multisampleState;
  VkPipelineVertexInputStateCreateInfo vertexInputState;
  VkPipelineViewportStateCreateInfo viewportState;
  VkRect2D scissors [1];
  VkViewport local_d8;
  VkPipelineDynamicStateCreateInfo dynamicState;
  VkPipelineColorBlendAttachmentState attachmentBlendState;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyState;
  VkSpecializationInfo shaderSpecialization;
  
  uVar35 = this->m_frameNdx;
  if (uVar35 == 0) {
    if (this->m_outOfDateCount == 0) {
      local_3d8._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
      poVar4 = (ostringstream *)(local_3d8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar4);
      std::operator<<((ostream *)poVar4,"Swapchain: ");
      ::vk::operator<<((ostream *)poVar4,&this->m_swapchainConfig);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar4);
    }
    VVar7 = (this->m_swapchainConfig).imageFormat;
    uVar8 = (this->m_swapchainConfig).imageExtent.width;
    uVar9 = (this->m_swapchainConfig).imageExtent.height;
    pDVar2 = &this->m_vkd;
    ::vk::createSwapchainKHR
              ((Move<vk::Handle<(vk::HandleType)26>_> *)&depthStencilState,
               &pDVar2->super_DeviceInterface,
               (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
               &this->m_swapchainConfig,(VkAllocationCallbacks *)0x0);
    allocateInfo.commandPool.m_internal._0_4_ = depthStencilState.flags;
    allocateInfo.commandPool.m_internal._4_4_ = depthStencilState.depthTestEnable;
    allocateInfo.level = depthStencilState.depthWriteEnable;
    allocateInfo.commandBufferCount = depthStencilState.depthCompareOp;
    allocateInfo.sType = depthStencilState.sType;
    allocateInfo._4_4_ = depthStencilState._4_4_;
    allocateInfo.pNext = depthStencilState.pNext;
    depthStencilState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    depthStencilState._4_4_ = 0;
    depthStencilState.pNext = (void *)0x0;
    depthStencilState.flags = 0;
    depthStencilState.depthTestEnable = 0;
    depthStencilState.depthWriteEnable = 0;
    depthStencilState.depthCompareOp = VK_COMPARE_OP_NEVER;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)26>_>::reset
              (&(this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>);
    (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_device =
         (VkDevice)allocateInfo.commandPool.m_internal;
    (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)allocateInfo._24_8_;
    (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.m_internal =
         allocateInfo._0_8_;
    (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)allocateInfo.pNext;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)26>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)26>_> *)&depthStencilState);
    ::vk::wsi::getSwapchainImages
              ((vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                *)&allocateInfo,&pDVar2->super_DeviceInterface,
               (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (VkSwapchainKHR)
               (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.
               m_internal);
    std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
    _M_move_assign(&this->m_swapchainImages,&allocateInfo);
    std::
    _Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
    ~_Vector_base((_Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                   *)&allocateInfo);
    stages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    stages[0].pNext = (void *)0x1;
    stages[0].flags = 0;
    stages[0].stage = VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT;
    stages[0].module.m_internal = 0x200000001;
    stages[0].pName = (char *)CONCAT44(stages[0].pName._4_4_,0x3b9acdea);
    colorAttachmentRefs[0].attachment = 0;
    colorAttachmentRefs[0].layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
    allocateInfo.commandPool.m_internal = 0;
    allocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    allocateInfo._4_4_ = 0;
    allocateInfo.pNext = (void *)0x0;
    depthStencilState.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
    depthStencilState.pNext = (void *)0x0;
    allocateInfo.level = VK_COMMAND_BUFFER_LEVEL_SECONDARY;
    allocateInfo.commandBufferCount = 0;
    depthStencilState.flags = 0;
    depthStencilState.depthTestEnable = 1;
    depthStencilState.depthBoundsTestEnable = 1;
    depthStencilState.front._8_8_ = (ulong)depthStencilState.front.compareOp << 0x20;
    depthStencilState.front.compareMask = 0;
    depthStencilState.front.writeMask = 0;
    depthStencilState._24_8_ = stages;
    depthStencilState.front._0_8_ = &allocateInfo;
    stages[0]._4_4_ = VVar7;
    ::vk::createRenderPass
              ((Move<vk::Handle<(vk::HandleType)17>_> *)&rasterizationState,
               &pDVar2->super_DeviceInterface,
               (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (VkRenderPassCreateInfo *)&depthStencilState,(VkAllocationCallbacks *)0x0);
    allocateInfo.commandPool.m_internal._0_4_ = rasterizationState.flags;
    allocateInfo.commandPool.m_internal._4_4_ = rasterizationState.depthClampEnable;
    allocateInfo.level = rasterizationState.rasterizerDiscardEnable;
    allocateInfo.commandBufferCount = rasterizationState.polygonMode;
    allocateInfo.sType = rasterizationState.sType;
    allocateInfo._4_4_ = rasterizationState._4_4_;
    allocateInfo.pNext = rasterizationState.pNext;
    rasterizationState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    rasterizationState._4_4_ = 0;
    rasterizationState.pNext = (void *)0x0;
    rasterizationState.flags = 0;
    rasterizationState.depthClampEnable = 0;
    rasterizationState.rasterizerDiscardEnable = 0;
    rasterizationState.polygonMode = VK_POLYGON_MODE_FILL;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::reset
              (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
         (VkDevice)allocateInfo.commandPool.m_internal;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)allocateInfo._24_8_;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
         allocateInfo._0_8_;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)allocateInfo.pNext;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&rasterizationState);
    stages[0].module.m_internal =
         (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
         m_internal;
    stages[1].module.m_internal =
         (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object
         .m_internal;
    stages[0].pSpecializationInfo = &shaderSpecialization;
    stages[1].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
    stages[0].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
    stages[0].pNext = (void *)0x0;
    stages[0].flags = 0;
    stages[0].stage = VK_SHADER_STAGE_VERTEX_BIT;
    stages[0].pName = "main";
    stages[1].pNext = (void *)0x0;
    stages[1].flags = 0;
    stages[1].stage = VK_SHADER_STAGE_FRAGMENT_BIT;
    shaderSpecialization.dataSize = 0;
    shaderSpecialization.pData = (void *)0x0;
    shaderSpecialization.mapEntryCount = 0;
    shaderSpecialization._4_4_ = 0;
    shaderSpecialization.pMapEntries = (VkSpecializationMapEntry *)0x0;
    stages[1].pName = "main";
    viewportState.pViewports = &local_d8;
    local_d8.x = 0.0;
    local_d8.y = 0.0;
    local_d8.width = (float)uVar8;
    local_d8.height = (float)uVar9;
    local_d8.minDepth = 0.0;
    local_d8.maxDepth = 1.0;
    viewportState.pScissors = scissors;
    scissors[0].offset.x = 0;
    scissors[0].offset.y = 0;
    viewportState.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
    viewportState.pNext = (void *)0x0;
    viewportState.flags = 0;
    viewportState.viewportCount = 1;
    viewportState.scissorCount = 1;
    rasterizationState.pNext = (void *)0x0;
    rasterizationState.rasterizerDiscardEnable = 0;
    rasterizationState.polygonMode = VK_POLYGON_MODE_FILL;
    rasterizationState.depthBiasEnable = 0;
    rasterizationState.depthBiasConstantFactor = 0.0;
    rasterizationState.depthBiasClamp = 0.0;
    rasterizationState.depthBiasSlopeFactor = 0.0;
    rasterizationState.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
    rasterizationState._4_4_ = 0;
    multisampleState.pSampleMask = &sampleMask;
    sampleMask = 0xffffffff;
    rasterizationState.flags = 0;
    rasterizationState.depthClampEnable = 1;
    rasterizationState.cullMode = 0;
    rasterizationState.frontFace = VK_FRONT_FACE_CLOCKWISE;
    multisampleState.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
    multisampleState.pNext = (void *)0x0;
    multisampleState.flags = 0;
    multisampleState.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
    multisampleState.sampleShadingEnable = 0;
    multisampleState.minSampleShading = 0.0;
    depthStencilState.pNext = (void *)0x0;
    depthStencilState.flags = 0;
    depthStencilState.depthTestEnable = 0;
    depthStencilState.front.compareMask = 0;
    depthStencilState.front.writeMask = 0;
    depthStencilState.back.writeMask = 0;
    depthStencilState.back.reference = 0;
    depthStencilState.front.reference = 0;
    depthStencilState.back.failOp = VK_STENCIL_OP_KEEP;
    depthStencilState.back.passOp = VK_STENCIL_OP_KEEP;
    depthStencilState.back.depthFailOp = VK_STENCIL_OP_KEEP;
    depthStencilState.depthBoundsTestEnable = 0;
    depthStencilState.stencilTestEnable = 0;
    depthStencilState.front.failOp = VK_STENCIL_OP_KEEP;
    depthStencilState.front.passOp = VK_STENCIL_OP_KEEP;
    depthStencilState.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
    depthStencilState._4_4_ = 0;
    depthStencilState.depthWriteEnable = 0;
    depthStencilState.depthCompareOp = VK_COMPARE_OP_ALWAYS;
    depthStencilState.front.depthFailOp = VK_STENCIL_OP_KEEP;
    depthStencilState.front.compareOp = VK_COMPARE_OP_ALWAYS;
    depthStencilState.back.compareOp = VK_COMPARE_OP_ALWAYS;
    depthStencilState.back.compareMask = 0;
    rasterizationState.lineWidth = 1.0;
    rasterizationState._60_4_ = 0;
    depthStencilState.minDepthBounds = 0.0;
    depthStencilState.maxDepthBounds = 1.0;
    colorAttachmentRefs[0].attachment = 0x1a;
    allocateInfo.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
    allocateInfo.pNext = (void *)0x0;
    allocateInfo.commandPool.m_internal = 0x200000000;
    vertexInputState.pNext = (void *)0x0;
    vertexInputState.vertexAttributeDescriptionCount = 0;
    vertexInputState._36_4_ = 0;
    vertexInputState.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
    vertexInputState.flags = 0;
    vertexInputState.vertexBindingDescriptionCount = 0;
    vertexInputState.pVertexBindingDescriptions = (VkVertexInputBindingDescription *)0x0;
    vertexInputState.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
    vertexInputState._4_4_ = 0;
    multisampleState.alphaToCoverageEnable = 0;
    multisampleState.alphaToOneEnable = 0;
    dynamicState.flags = 0;
    dynamicState.dynamicStateCount = 0;
    dynamicState.pDynamicStates = (VkDynamicState *)0x0;
    dynamicState.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
    dynamicState._4_4_ = 0;
    dynamicState.pNext = (void *)0x0;
    stages[1].pSpecializationInfo = stages[0].pSpecializationInfo;
    allocateInfo._24_8_ = stages;
    scissors[0].extent.width = uVar8;
    scissors[0].extent.height = uVar9;
    ::vk::createGraphicsPipeline
              ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_258,&pDVar2->super_DeviceInterface,
               (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,(VkPipelineCache)0x0,
               (VkGraphicsPipelineCreateInfo *)&allocateInfo,(VkAllocationCallbacks *)0x0);
    allocateInfo.commandPool.m_internal = (deUint64)local_258.m_data.deleter.m_device;
    allocateInfo._24_8_ = local_258.m_data.deleter.m_allocator;
    allocateInfo._0_8_ = local_258.m_data.object.m_internal;
    allocateInfo.pNext = local_258.m_data.deleter.m_deviceIface;
    local_258.m_data.deleter.m_device = (VkDevice)0x0;
    local_258.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    local_258.m_data.object.m_internal = 0;
    local_258.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::reset
              (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>);
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
         (VkDevice)allocateInfo.commandPool.m_internal;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)allocateInfo._24_8_;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
         allocateInfo._0_8_;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)allocateInfo.pNext;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_258);
    depthStencilState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    depthStencilState._4_4_ = 0;
    std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
    vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
            *)&allocateInfo,
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)&depthStencilState,
           (allocator_type *)stages);
    __x = &this->m_swapchainImageViews;
    std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
    _M_move_assign(__x,&allocateInfo);
    std::
    _Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
    ~_Vector_base((_Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                   *)&allocateInfo);
    depthStencilState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    depthStencilState._4_4_ = 0;
    std::vector<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>::
    vector((vector<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
            *)&allocateInfo,
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)&depthStencilState,
           (allocator_type *)stages);
    std::vector<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>::
    _M_move_assign(&this->m_framebuffers,&allocateInfo);
    std::
    _Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>::
    ~_Vector_base((_Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
                   *)&allocateInfo);
    depthStencilState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    depthStencilState._4_4_ = 0;
    std::vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
    vector((vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_> *
           )&allocateInfo,
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)&depthStencilState,
           (allocator_type *)stages);
    std::vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
    _M_move_assign(&this->m_acquireSemaphores,&allocateInfo);
    std::
    _Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
    ~_Vector_base((_Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                   *)&allocateInfo);
    depthStencilState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    depthStencilState._4_4_ = 0;
    std::vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
    vector((vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_> *
           )&allocateInfo,
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)&depthStencilState,
           (allocator_type *)stages);
    std::vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
    _M_move_assign(&this->m_renderSemaphores,&allocateInfo);
    std::
    _Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
    ~_Vector_base((_Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                   *)&allocateInfo);
    depthStencilState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    depthStencilState._4_4_ = 0;
    std::vector<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>::
    vector((vector<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_> *
           )&allocateInfo,6,(value_type *)&depthStencilState,(allocator_type *)stages);
    std::vector<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>::
    _M_move_assign(&this->m_fences,&allocateInfo);
    std::
    _Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>::
    ~_Vector_base((_Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
                   *)&allocateInfo);
    depthStencilState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    depthStencilState._4_4_ = 0;
    std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::vector
              ((vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> *)
               &allocateInfo,
               (long)(this->m_fences).
                     super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_fences).
                     super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)&depthStencilState
               ,(allocator_type *)stages);
    std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::_M_move_assign
              (&this->m_commandBuffers,&allocateInfo);
    std::_Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::
    ~_Vector_base((_Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> *
                  )&allocateInfo);
    (this->m_freeAcquireSemaphore).m_internal = 0;
    (this->m_freeRenderSemaphore).m_internal = 0;
    ::vk::createSemaphore
              ((Move<vk::Handle<(vk::HandleType)4>_> *)&allocateInfo,&pDVar2->super_DeviceInterface,
               (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,0,
               (VkAllocationCallbacks *)0x0);
    uVar23 = allocateInfo._0_8_;
    allocateInfo.commandPool.m_internal = 0;
    allocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    allocateInfo.commandBufferCount = 0;
    allocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    allocateInfo._4_4_ = 0;
    allocateInfo.pNext = (void *)0x0;
    (this->m_freeAcquireSemaphore).m_internal = uVar23;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)4>_> *)&allocateInfo);
    ::vk::createSemaphore
              ((Move<vk::Handle<(vk::HandleType)4>_> *)&allocateInfo,&pDVar2->super_DeviceInterface,
               (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,0,
               (VkAllocationCallbacks *)0x0);
    uVar23 = allocateInfo._0_8_;
    allocateInfo.commandPool.m_internal = 0;
    allocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    allocateInfo.commandBufferCount = 0;
    allocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    allocateInfo._4_4_ = 0;
    allocateInfo.pNext = (void *)0x0;
    (this->m_freeRenderSemaphore).m_internal = uVar23;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)4>_> *)&allocateInfo);
    pVVar11 = (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
    for (uVar35 = 0;
        uVar35 < (ulong)((long)(this->m_swapchainImageViews).
                               super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_swapchainImageViews).
                               super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar35 = uVar35 + 1)
    {
      allocateInfo._24_8_ =
           (this->m_swapchainImages).
           super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar35].m_internal;
      allocateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
      allocateInfo.pNext = (void *)0x0;
      allocateInfo.commandPool.m_internal = allocateInfo.commandPool.m_internal & 0xffffffff00000000
      ;
      ::vk::createImageView
                ((Move<vk::Handle<(vk::HandleType)13>_> *)&depthStencilState,
                 &pDVar2->super_DeviceInterface,pVVar11,(VkImageViewCreateInfo *)&allocateInfo,
                 (VkAllocationCallbacks *)0x0);
      uVar23 = depthStencilState._0_8_;
      depthStencilState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      depthStencilState._4_4_ = 0;
      depthStencilState.pNext = (void *)0x0;
      depthStencilState.flags = 0;
      depthStencilState.depthTestEnable = 0;
      depthStencilState.depthWriteEnable = 0;
      depthStencilState.depthCompareOp = VK_COMPARE_OP_NEVER;
      (__x->
      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      )._M_impl.super__Vector_impl_data._M_start[uVar35].m_internal = uVar23;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&depthStencilState);
    }
    pVVar11 = (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
    dVar30 = (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal;
    std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
    vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
            *)stages,__x);
    for (uVar35 = 0;
        uVar35 < (ulong)((long)(this->m_framebuffers).
                               super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_framebuffers).
                               super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar35 = uVar35 + 1)
    {
      rasterizationState._0_8_ = *(undefined8 *)(stages[0]._0_8_ + uVar35 * 8);
      allocateInfo.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
      allocateInfo.pNext = (void *)0x0;
      allocateInfo.commandPool.m_internal = allocateInfo.commandPool.m_internal & 0xffffffff00000000
      ;
      allocateInfo._24_8_ = dVar30;
      ::vk::createFramebuffer
                ((Move<vk::Handle<(vk::HandleType)23>_> *)&depthStencilState,
                 &pDVar2->super_DeviceInterface,pVVar11,(VkFramebufferCreateInfo *)&allocateInfo,
                 (VkAllocationCallbacks *)0x0);
      uVar23 = depthStencilState._0_8_;
      depthStencilState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      depthStencilState._4_4_ = 0;
      depthStencilState.pNext = (void *)0x0;
      depthStencilState.flags = 0;
      depthStencilState.depthTestEnable = 0;
      depthStencilState.depthWriteEnable = 0;
      depthStencilState.depthCompareOp = VK_COMPARE_OP_NEVER;
      (this->m_framebuffers).
      super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar35].m_internal = uVar23;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&depthStencilState);
    }
    std::
    _Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
    ~_Vector_base((_Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                   *)stages);
    initSemaphores(&pDVar2->super_DeviceInterface,
                   (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   &this->m_acquireSemaphores);
    initSemaphores(&pDVar2->super_DeviceInterface,
                   (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   &this->m_renderSemaphores);
    pVVar11 = (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
    for (uVar35 = 0;
        uVar35 < (ulong)((long)(this->m_fences).
                               super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_fences).
                               super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar35 = uVar35 + 1)
    {
      ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&allocateInfo,
                        &pDVar2->super_DeviceInterface,pVVar11,0,(VkAllocationCallbacks *)0x0);
      uVar23 = allocateInfo._0_8_;
      allocateInfo.commandPool.m_internal = 0;
      allocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
      allocateInfo.commandBufferCount = 0;
      allocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      allocateInfo._4_4_ = 0;
      allocateInfo.pNext = (void *)0x0;
      (this->m_fences).
      super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar35].m_internal = uVar23;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&allocateInfo);
    }
    if (this->m_useDisplayTiming == true) {
      local_3c8._8_8_ = local_3d8 + 8;
      local_3c8._M_allocated_capacity = 0;
      local_3d8._0_8_ = (TestLog *)0x0;
      local_3d8._8_8_ = 0;
      local_3b0.width = 0;
      local_3b0.height = 0;
      local_3b8 = (_Base_ptr)local_3c8._8_8_;
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
      ::operator=(&(this->m_queuePresentTimes)._M_t,
                  (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                   *)local_3d8);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                   *)local_3d8);
      ::vk::DeviceDriver::getRefreshCycleDurationGOOGLE
                (pDVar2,(this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
                 (VkSwapchainKHR)
                 (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.
                 m_internal,&this->m_rcDuration);
      this->m_refreshDurationMultiplier = 1;
      this->m_targetIPD = (this->m_rcDuration).refreshDuration;
      this->m_prevDesiredPresentTime = 0;
      this->m_nextPresentID = 0;
      this->m_ignoreThruPresentID = 0;
    }
    uVar35 = this->m_frameNdx;
  }
  pHVar12 = (this->m_fences).
            super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar34 = (long)(this->m_fences).
                 super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar12 >> 3;
  colorAttachmentRefs[0] = *(VkAttachmentReference *)(pHVar12 + uVar35 % uVar34);
  VVar6 = (this->m_swapchainConfig).imageExtent;
  pTVar13 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  if (uVar34 <= uVar35) {
    pDVar2 = &this->m_vkd;
    VVar26 = ::vk::DeviceDriver::waitForFences
                       (pDVar2,(this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,1,
                        (VkFence *)colorAttachmentRefs,1,0xffffffffffffffff);
    ::vk::checkResult(VVar26,"m_vkd.waitForFences(*m_device, 1u, &fence, VK_TRUE, foreverNs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x43d);
    VVar26 = ::vk::DeviceDriver::resetFences
                       (pDVar2,(this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,1,
                        (VkFence *)colorAttachmentRefs);
    ::vk::checkResult(VVar26,"m_vkd.resetFences(*m_device, 1u, &fence)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x43e);
    ppVVar14 = (this->m_commandBuffers).
               super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ::vk::DeviceDriver::freeCommandBuffers
              (pDVar2,(this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (VkCommandPool)
               (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
               m_internal,1,
               ppVVar14 +
               this->m_frameNdx %
               (ulong)((long)(this->m_commandBuffers).
                             super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar14 >> 3));
    ppVVar14 = (this->m_commandBuffers).
               super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppVVar14[this->m_frameNdx %
             (ulong)((long)(this->m_commandBuffers).
                           super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar14 >> 3)] =
         (VkCommandBuffer_s *)0x0;
  }
  vertexInputState._0_8_ = (this->m_freeAcquireSemaphore).m_internal;
  viewportState._0_8_ = (this->m_freeRenderSemaphore).m_internal;
  pDVar2 = &this->m_vkd;
  VVar26 = ::vk::DeviceDriver::acquireNextImageKHR
                     (pDVar2,(this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
                      (VkSwapchainKHR)
                      (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.
                      object.m_internal,0xffffffffffffffff,(VkSemaphore)vertexInputState._0_8_,
                      (VkFence)colorAttachmentRefs[0],&multisampleState.sType);
  ::vk::checkResult(VVar26,
                    "m_vkd.acquireNextImageKHR(*m_device, *m_swapchain, foreverNs, currentAcquireSemaphore, fence, &imageIndex)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                    ,0x449);
  allocateInfo.commandPool.m_internal =
       (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
  ;
  dVar30 = (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
           m_internal;
  p_Var15 = (_Base_ptr)
            (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
            m_internal;
  p_Var16 = (_Base_ptr)
            (this->m_framebuffers).
            super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
            ._M_impl.super__Vector_impl_data._M_start[multisampleState.sType].m_internal;
  dVar17 = (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
           m_internal;
  sVar18 = this->m_frameNdx;
  dVar10 = this->m_quadCount;
  allocateInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  allocateInfo.pNext = (void *)0x0;
  allocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  allocateInfo.commandBufferCount = 1;
  depthStencilState.flags = 0;
  depthStencilState.depthTestEnable = 0;
  depthStencilState.depthWriteEnable = 0;
  depthStencilState.depthCompareOp = VK_COMPARE_OP_NEVER;
  depthStencilState.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  depthStencilState._4_4_ = 0;
  depthStencilState.pNext = (void *)0x0;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)stages,&pDVar2->super_DeviceInterface,
             (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,&allocateInfo);
  VVar26 = (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x49])
                     (pDVar2,stages[0]._0_8_,&depthStencilState);
  ::vk::checkResult(VVar26,"vkd.beginCommandBuffer(*commandBuffer, &beginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                    ,0x12f);
  rasterizationState.sType = 0x3e800000;
  rasterizationState._4_4_ = 0x3f000000;
  local_3d8._0_4_ = 0x2b;
  local_3d8._8_8_ = 0;
  rasterizationState.pNext = (void *)0x3f8000003f400000;
  local_3b8 = (_Base_ptr)0x0;
  local_3a8 = 1;
  local_3c8._M_allocated_capacity = (size_type)p_Var15;
  local_3c8._8_8_ = p_Var16;
  local_3b0 = VVar6;
  local_3a0 = &rasterizationState;
  (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x74])(pDVar2,stages[0]._0_8_,local_3d8,0)
  ;
  uVar23 = stages[0]._0_8_;
  rasterizationState.sType = (VkStructureType)sVar18;
  (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x73])
            (pDVar2,stages[0]._0_8_,dVar30,0x10,0,4,&rasterizationState);
  (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x4c])(pDVar2,uVar23,0,dVar17);
  (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x59])
            (pDVar2,uVar23,(ulong)(dVar10 * 6),1,0,0);
  (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x76])(pDVar2,stages[0]._0_8_);
  VVar26 = (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x4a])(pDVar2,stages[0]._0_8_);
  ::vk::checkResult(VVar26,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                    ,0x149);
  uVar23 = stages[0]._0_8_;
  stages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  stages[0]._4_4_ = 0;
  stages[0].pNext = (void *)0x0;
  stages[0].flags = 0;
  stages[0].stage = 0;
  stages[0].module.m_internal = 0;
  ppVVar14 = (this->m_commandBuffers).
             super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppVVar14[this->m_frameNdx %
           (ulong)((long)(this->m_commandBuffers).
                         super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar14 >> 3)] =
       (VkCommandBuffer_s *)uVar23;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)stages);
  if (this->m_useDisplayTiming != true) goto LAB_006cf197;
  pVVar19 = (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
  dVar30 = (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.
           m_internal;
  stages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  stages[0]._4_4_ = 0;
  stages[0].pNext = (void *)0x0;
  stages[0].flags = 0;
  stages[0].stage = 0;
  local_3d8._0_8_ = local_3d8._0_8_ & 0xffffffff00000000;
  (*(this->m_vkd).super_DeviceInterface._vptr_DeviceInterface[0x95])(pDVar2,pVVar19,dVar30);
  std::
  vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>::
  resize((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
          *)stages,local_3d8._0_8_ & 0xffffffff);
  if (local_3d8._0_4_ != 0) {
    (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x95])(pDVar2,pVVar19,dVar30,local_3d8);
  }
  poVar4 = (ostringstream *)(local_3d8 + 8);
  this_00 = (ostringstream *)(local_3d8 + 8);
  lVar32 = 0;
  bVar24 = false;
  bVar25 = false;
  uVar35 = 0;
  while( true ) {
    if ((ulong)(((long)stages[0].pNext - stages[0]._0_8_) / 0x28) <= uVar35) break;
    pmVar28 = std::
              map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
              ::operator[](&this->m_queuePresentTimes,(key_type *)(stages[0]._0_8_ + lVar32));
    if (*(ulong *)(stages[0]._0_8_ + 0x10 + lVar32) < *pmVar28) {
      de::toString<unsigned_int>((string *)&depthStencilState,(uint *)(stages[0]._0_8_ + lVar32));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &allocateInfo,"Image with PresentID ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &depthStencilState);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &allocateInfo,"was displayed before vkQueuePresentKHR was called.");
      tcu::ResultCollector::fail
                (&this->m_resultCollector,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8);
      std::__cxx11::string::~string((string *)local_3d8);
      std::__cxx11::string::~string((string *)&allocateInfo);
      std::__cxx11::string::~string((string *)&depthStencilState);
    }
    if (this->m_ignoreThruPresentID == 0) {
      this->m_prevDesiredPresentTime =
           (ulong)(this->m_nextPresentID - *(int *)((long)stages[0].pNext + -0x28)) *
           this->m_targetIPD + *(long *)((long)stages[0].pNext + -0x18);
      this->m_ignoreThruPresentID = *(int *)(stages[0]._0_8_ + lVar32) + 1;
    }
    else {
      poVar5 = (ostringstream *)(local_3d8 + 8);
      if (this->m_ignoreThruPresentID < *(uint *)(stages[0]._0_8_ + lVar32)) {
        lVar20 = *(long *)(stages[0]._0_8_ + 8 + lVar32);
        uVar34 = *(ulong *)(stages[0]._0_8_ + 0x10 + lVar32);
        dVar30 = (this->m_rcDuration).refreshDuration;
        if (dVar30 + lVar20 + 1000000 < uVar34) {
          local_3d8._0_8_ = pTVar13;
          std::__cxx11::ostringstream::ostringstream(poVar5);
          std::operator<<((ostream *)poVar5,"Image PresentID ");
          pMVar29 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_3d8,(uint *)(stages[0]._0_8_ + lVar32));
          poVar1 = &pMVar29->m_str;
          std::operator<<((ostream *)poVar1," was ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<((ostream *)poVar1," nsec late.");
          tcu::MessageBuilder::operator<<(pMVar29,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_3d8 + 8));
          if ((this->m_ExpectImage80Late == true) && (*(int *)(stages[0]._0_8_ + lVar32) == 0x50)) {
            if (uVar34 - (dVar30 + lVar20) < 0x1dcd6501) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_3d8,
                         "Image PresentID 80 was not late by approximately 1 second, as expected.",
                         (allocator<char> *)&allocateInfo);
              tcu::ResultCollector::fail(&this->m_resultCollector,(string *)local_3d8);
              std::__cxx11::string::~string((string *)local_3d8);
            }
            else {
              local_3d8._0_8_ = pTVar13;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_3d8 + 8));
              std::operator<<((ostream *)(local_3d8 + 8),
                              "\tNote: Image PresentID 80 was expected to be late by approximately 1 second."
                             );
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_3d8 + 8));
            }
          }
          poVar5 = (ostringstream *)(local_3d8 + 8);
          local_3d8._0_8_ = pTVar13;
          std::__cxx11::ostringstream::ostringstream(poVar5);
          std::operator<<((ostream *)poVar5,"\t\t   actualPresentTime = ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::operator<<((ostream *)poVar5," nsec");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar5);
          poVar5 = (ostringstream *)(local_3d8 + 8);
          local_3d8._0_8_ = pTVar13;
          std::__cxx11::ostringstream::ostringstream(poVar5);
          std::operator<<((ostream *)poVar5,"\t\t - desiredPresentTime= ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::operator<<((ostream *)poVar5," nsec");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar5);
          local_3d8._0_8_ = pTVar13;
          std::__cxx11::ostringstream::ostringstream(poVar4);
          std::operator<<((ostream *)poVar4,"\t\t =========================================");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar4);
          poVar5 = (ostringstream *)(local_3d8 + 8);
          local_3d8._0_8_ = pTVar13;
          std::__cxx11::ostringstream::ostringstream(poVar5);
          std::operator<<((ostream *)poVar5,"\t\t   diff              =       ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::operator<<((ostream *)poVar5," nsec");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar5);
          poVar5 = (ostringstream *)(local_3d8 + 8);
          local_3d8._0_8_ = pTVar13;
          std::__cxx11::ostringstream::ostringstream(poVar5);
          std::operator<<((ostream *)poVar5,"\t\t - refreshDuration   =       ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::operator<<((ostream *)poVar5," nsec");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar5);
          local_3d8._0_8_ = pTVar13;
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::operator<<((ostream *)this_00,"\t\t =========================================");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          poVar5 = (ostringstream *)(local_3d8 + 8);
          local_3d8._0_8_ = pTVar13;
          std::__cxx11::ostringstream::ostringstream(poVar5);
          std::operator<<((ostream *)poVar5,"\t\t   diff              =        ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::operator<<((ostream *)poVar5," nsec");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar5);
          bVar25 = true;
        }
        else if ((*(ulong *)(stages[0]._0_8_ + 0x18 + lVar32) < uVar34) &&
                ("ERKS_" < *(char **)(stages[0]._0_8_ + 0x20 + lVar32))) {
          local_3d8._0_8_ = pTVar13;
          std::__cxx11::ostringstream::ostringstream(poVar5);
          std::operator<<((ostream *)poVar5,"Image PresentID ");
          pMVar29 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_3d8,(uint *)(stages[0]._0_8_ + lVar32));
          poVar1 = &pMVar29->m_str;
          std::operator<<((ostream *)poVar1," can be presented ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<((ostream *)poVar1," nsec earlier.");
          tcu::MessageBuilder::operator<<(pMVar29,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_3d8 + 8));
          poVar5 = (ostringstream *)(local_3d8 + 8);
          local_3d8._0_8_ = pTVar13;
          std::__cxx11::ostringstream::ostringstream(poVar5);
          std::operator<<((ostream *)poVar5,"\t\t   actualPresentTime = ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::operator<<((ostream *)poVar5," nsec");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar5);
          poVar5 = (ostringstream *)(local_3d8 + 8);
          local_3d8._0_8_ = pTVar13;
          std::__cxx11::ostringstream::ostringstream(poVar5);
          std::operator<<((ostream *)poVar5,"\t\t -earliestPresentTime= ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::operator<<((ostream *)poVar5," nsec");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar5);
          local_3d8._0_8_ = pTVar13;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_3d8 + 8));
          std::operator<<((ostream *)(local_3d8 + 8),
                          "\t\t =========================================");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_3d8 + 8));
          poVar5 = (ostringstream *)(local_3d8 + 8);
          local_3d8._0_8_ = pTVar13;
          std::__cxx11::ostringstream::ostringstream(poVar5);
          std::operator<<((ostream *)poVar5,"\t\t   diff              =        ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::operator<<((ostream *)poVar5," nsec");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar5);
          bVar24 = true;
        }
      }
    }
    uVar35 = uVar35 + 1;
    lVar32 = lVar32 + 0x28;
  }
  if (bVar25) {
    uVar35 = this->m_refreshDurationMultiplier + 1;
    this->m_refreshDurationMultiplier = uVar35;
    if (uVar35 < 3) {
      local_3d8._0_8_ = pTVar13;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_3d8 + 8));
      std::operator<<((ostream *)(local_3d8 + 8),"Increasing multiplier.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_006cf167:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_3d8 + 8));
    }
    else {
      this->m_refreshDurationMultiplier = 2;
    }
  }
  else if (bVar24) {
    pdVar3 = &this->m_refreshDurationMultiplier;
    *pdVar3 = *pdVar3 - 1;
    if (*pdVar3 != 0) {
      local_3d8._0_8_ = pTVar13;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_3d8 + 8));
      std::operator<<((ostream *)(local_3d8 + 8),"Decreasing multiplier.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_006cf167;
    }
    this->m_refreshDurationMultiplier = 1;
  }
  this->m_targetIPD = this->m_refreshDurationMultiplier * (this->m_rcDuration).refreshDuration;
  std::
  _Vector_base<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
  ::~_Vector_base((_Vector_base<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
                   *)stages);
LAB_006cf197:
  depthStencilState.sType = 0x400;
  allocateInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  allocateInfo.pNext = (void *)0x0;
  allocateInfo.commandPool.m_internal._0_4_ = 1;
  allocateInfo._24_8_ = &vertexInputState;
  VVar26 = ::vk::DeviceDriver::queueSubmit
                     (pDVar2,this->m_queue,1,(VkSubmitInfo *)&allocateInfo,(VkFence)0x0);
  ::vk::checkResult(VVar26,"m_vkd.queueSubmit(m_queue, 1u, &submitInfo, (vk::VkFence)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                    ,0x4ba);
  if (this->m_useDisplayTiming == true) {
    VVar33 = this->m_nextPresentID + VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    this->m_nextPresentID = VVar33;
    stages[0].sType = VVar33;
    pvVar21 = (void *)this->m_prevDesiredPresentTime;
    stages[0].pNext = pvVar21;
    dVar30 = deGetMicroseconds();
    pmVar28 = std::
              map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
              ::operator[](&this->m_queuePresentTimes,&this->m_nextPresentID);
    mVar31 = dVar30 * 1000;
    *pmVar28 = mVar31;
    if (this->m_prevDesiredPresentTime == 0) {
      if (mVar31 == 0) {
        stages[0].pNext = (void *)0x0;
        dVar30 = 0;
      }
      else {
        stages[0].pNext = (void *)((this->m_targetIPD >> 1) + mVar31);
        dVar30 = 0;
      }
    }
    else {
      dVar30 = this->m_prevDesiredPresentTime + this->m_targetIPD;
      if (VVar33 == 0x50) {
        stages[0].pNext = (void *)((long)pvVar21 - 1000000000);
        this->m_ExpectImage80Late = true;
      }
    }
    depthStencilState._24_8_ = stages;
    this->m_prevDesiredPresentTime = dVar30;
    depthStencilState.sType = VK_STRUCTURE_TYPE_PRESENT_TIMES_INFO_GOOGLE;
    depthStencilState.pNext = (void *)0x0;
    depthStencilState.flags = 1;
    allocateInfo.sType = VK_STRUCTURE_TYPE_PRESENT_INFO_KHR;
    allocateInfo.pNext = &depthStencilState;
    allocateInfo.commandPool.m_internal._0_4_ = 1;
    allocateInfo._24_8_ = &viewportState;
    VVar26 = ::vk::DeviceDriver::queuePresentKHR
                       (pDVar2,this->m_queue,(VkPresentInfoKHR *)&allocateInfo);
    ::vk::checkResult(VVar26,"m_vkd.queuePresentKHR(m_queue, &presentInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x4fd);
    ::vk::checkResult(rasterizationState.sType,"result",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x4fe);
  }
  else {
    allocateInfo.sType = VK_STRUCTURE_TYPE_PRESENT_INFO_KHR;
    allocateInfo.pNext = (void *)0x0;
    allocateInfo.commandPool.m_internal._0_4_ = 1;
    allocateInfo._24_8_ = &viewportState;
    VVar26 = ::vk::DeviceDriver::queuePresentKHR
                       (pDVar2,this->m_queue,(VkPresentInfoKHR *)&allocateInfo);
    ::vk::checkResult(VVar26,"m_vkd.queuePresentKHR(m_queue, &presentInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x50f);
    ::vk::checkResult(depthStencilState.sType,"result",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x510);
  }
  uVar35 = (ulong)multisampleState.sType;
  pHVar22 = (this->m_acquireSemaphores).
            super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (this->m_freeAcquireSemaphore).m_internal = pHVar22[uVar35].m_internal;
  pHVar22[uVar35].m_internal = vertexInputState._0_8_;
  pHVar22 = (this->m_renderSemaphores).
            super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (this->m_freeRenderSemaphore).m_internal = pHVar22[uVar35].m_internal;
  pHVar22[uVar35].m_internal = viewportState._0_8_;
  uVar35 = this->m_frameNdx + 1;
  this->m_frameNdx = uVar35;
  if (uVar35 < this->m_frameCount) {
    tcu::TestStatus::incomplete();
  }
  else {
    deinitSwapchainResources(this);
    qVar27 = tcu::ResultCollector::getResult(&this->m_resultCollector);
    std::__cxx11::string::string((string *)local_3d8,(string *)&(this->m_resultCollector).m_message)
    ;
    __return_storage_ptr__->m_code = qVar27;
    std::__cxx11::string::string
              ((string *)&__return_storage_ptr__->m_description,(string *)local_3d8);
    std::__cxx11::string::~string((string *)local_3d8);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus DisplayTimingTestInstance::iterate (void)
{
	// Initialize swapchain specific resources
	// Render test
	try
	{
		if (m_frameNdx == 0)
		{
			if (m_outOfDateCount == 0)
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Swapchain: " << m_swapchainConfig << tcu::TestLog::EndMessage;

			initSwapchainResources();
		}

		render();
	}
	catch (const vk::Error& error)
	{
		if (error.getError() == vk::VK_ERROR_OUT_OF_DATE_KHR)
		{
			if (m_outOfDateCount < m_maxOutOfDateCount)
			{
				m_context.getTestContext().getLog() << TestLog::Message << "Frame " << m_frameNdx << ": Swapchain out of date. Recreating resources." << TestLog::EndMessage;
				deinitSwapchainResources();
				m_frameNdx = 0;
				m_outOfDateCount++;

				return tcu::TestStatus::incomplete();
			}
			else
			{
				m_context.getTestContext().getLog() << TestLog::Message << "Frame " << m_frameNdx << ": Swapchain out of date." << TestLog::EndMessage;
				m_resultCollector.fail("Received too many VK_ERROR_OUT_OF_DATE_KHR errors. Received " + de::toString(m_outOfDateCount) + ", max " + de::toString(m_maxOutOfDateCount));
			}
		}
		else
		{
			m_resultCollector.fail(error.what());
		}

		deinitSwapchainResources();

		return tcu::TestStatus(m_resultCollector.getResult(), m_resultCollector.getMessage());
	}

	m_frameNdx++;

	if (m_frameNdx >= m_frameCount)
	{
		deinitSwapchainResources();

		return tcu::TestStatus(m_resultCollector.getResult(), m_resultCollector.getMessage());
	}
	else
		return tcu::TestStatus::incomplete();
}